

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_decompressSequencesLong
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  seq_t sequence;
  seq_t sequence_00;
  seq_t sequence_01;
  seq_t sequence_02;
  seq_t sequence_03;
  seq_t sequence_04;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  BYTE *pBVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  uint uVar15;
  BYTE **ppBVar16;
  BYTE *pBVar17;
  size_t sVar18;
  BYTE *pBVar19;
  ulong uVar20;
  BYTE *oend;
  BYTE *pBVar21;
  int iVar22;
  uint uVar23;
  BYTE *pBVar24;
  undefined4 in_register_0000008c;
  ulong uVar25;
  ulong *puVar26;
  BYTE *pBVar27;
  ulong *puVar28;
  BYTE *pBVar29;
  bool bVar30;
  BYTE *litPtr;
  seq_t sequences [8];
  BYTE *local_248;
  BYTE *local_240;
  BYTE *local_238;
  undefined8 local_230;
  BYTE *local_228;
  BYTE *local_220;
  BYTE *local_218;
  BYTE *local_210;
  BYTE *local_208;
  BYTE *local_200;
  BIT_DStream_t local_1f8;
  ZSTD_fseState local_1d0;
  ZSTD_fseState local_1c0;
  ZSTD_fseState local_1b0;
  BYTE *local_1a0 [3];
  ulong uStack_188;
  BYTE *local_180;
  ulong local_178;
  size_t sStack_170;
  ulong local_168;
  BYTE *local_160;
  BYTE *local_158;
  uint local_14c;
  BYTE *local_148;
  BYTE *local_140;
  ulong local_138;
  BYTE *local_130;
  ulong *local_128;
  ulong *local_120;
  ZSTD_seqSymbol *local_118;
  ZSTD_seqSymbol *local_110;
  ZSTD_seqSymbol *local_108;
  ulong *local_100;
  ulong local_f8;
  size_t local_f0;
  ulong local_e8 [23];
  
  if (dctx->bmi2 != 0) {
    sVar9 = ZSTD_decompressSequencesLong_bmi2
                      (dctx,dst,maxDstSize,seqStart,seqSize,nbSeq,isLongOffset);
    return sVar9;
  }
  if (dctx->litBufferLocation == ZSTD_in_dst) {
    local_218 = dctx->litBuffer;
  }
  else {
    sVar9 = 0;
    if (0 < (long)maxDstSize) {
      sVar9 = maxDstSize;
    }
    local_218 = (BYTE *)(sVar9 + (long)dst);
  }
  pBVar11 = dctx->litPtr;
  pBVar21 = dctx->litBufferEnd;
  local_248 = pBVar11;
  local_200 = (BYTE *)dst;
  if (nbSeq == 0) goto LAB_01d994ee;
  pBVar11 = (BYTE *)dctx->prefixStart;
  local_210 = (BYTE *)dctx->virtualStart;
  local_220 = (BYTE *)dctx->dictEnd;
  dctx->fseEntropy = 1;
  lVar10 = -0xc;
  do {
    *(ulong *)((long)&uStack_188 + lVar10 * 2) =
         (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar10);
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0);
  uVar23 = 8;
  if (nbSeq < 8) {
    uVar23 = nbSeq;
  }
  if (seqSize == 0) {
    local_1f8.ptr = (char *)0x0;
    local_1f8.start = (char *)0x0;
    local_1f8.bitContainer = 0;
    local_1f8._8_8_ = 0;
    local_1f8.limitPtr = (char *)0x0;
LAB_01d994d5:
    bVar30 = false;
    pBVar11 = (BYTE *)0xffffffffffffffec;
  }
  else {
    local_1f8.limitPtr = (char *)((long)seqStart + 8);
    local_1f8.start = (char *)seqStart;
    if (seqSize < 8) {
      local_1f8.bitContainer = (BitContainerType)*seqStart;
      switch(seqSize) {
      case 7:
        local_1f8.bitContainer =
             (ulong)*(byte *)((long)seqStart + 6) << 0x30 | local_1f8.bitContainer;
      case 6:
        local_1f8.bitContainer =
             local_1f8.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
      case 5:
        local_1f8.bitContainer =
             local_1f8.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
      case 4:
        local_1f8.bitContainer =
             local_1f8.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
      case 3:
        local_1f8.bitContainer =
             local_1f8.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
      case 2:
        local_1f8.bitContainer =
             local_1f8.bitContainer + (ulong)*(byte *)((long)seqStart + 1) * 0x100;
      }
      bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar7 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      local_1f8.bitsConsumed = ~uVar7 + 9;
      if (bVar1 == 0) {
        local_1f8.bitsConsumed = 0;
      }
      local_1f8.ptr = (char *)seqStart;
      if (bVar1 == 0) goto LAB_01d994d5;
      local_1f8.bitsConsumed = local_1f8.bitsConsumed + (int)seqSize * -8 + 0x40;
    }
    else {
      local_1f8.ptr = (char *)((long)seqStart + (seqSize - 8));
      local_1f8.bitContainer = *(BitContainerType *)local_1f8.ptr;
      bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar7 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      local_1f8.bitsConsumed = ~uVar7 + 9;
      if (bVar1 == 0) {
        local_1f8.bitsConsumed = 0;
      }
      if (bVar1 == 0 || 0xffffffffffffff88 < seqSize) goto LAB_01d994d5;
    }
    local_238 = pBVar21;
    local_230 = CONCAT44(in_register_0000008c,nbSeq);
    local_14c = uVar23;
    ZSTD_initFseState(&local_1d0,&local_1f8,dctx->LLTptr);
    ZSTD_initFseState(&local_1c0,&local_1f8,dctx->OFTptr);
    uVar5 = local_230;
    ZSTD_initFseState(&local_1b0,&local_1f8,dctx->MLTptr);
    uVar23 = (uint)uVar5;
    if ((int)uVar23 < 1) {
      puVar26 = (ulong *)0x0;
    }
    else {
      local_240 = (BYTE *)local_1f8.bitContainer;
      local_148 = (BYTE *)(ulong)(uVar23 - 1);
      local_108 = local_1d0.table;
      local_110 = local_1b0.table;
      local_118 = local_1c0.table;
      local_120 = (ulong *)local_1f8.limitPtr;
      local_128 = (ulong *)local_1f8.start;
      local_228 = local_1a0[1];
      local_100 = (ulong *)(ulong)local_14c;
      puVar28 = local_e8;
      puVar26 = (ulong *)0x0;
      pBVar21 = local_1a0[0];
      pBVar24 = (BYTE *)local_1d0.state;
      pBVar27 = (BYTE *)local_1f8.ptr;
      sVar9 = local_1b0.state;
      pBVar29 = (BYTE *)local_1c0.state;
      uVar7 = local_1f8.bitsConsumed;
      do {
        local_1a0[1] = pBVar21;
        local_180 = pBVar27;
        uVar20 = (ulong)local_1b0.table[sVar9].baseValue;
        uVar15 = local_1d0.table[(long)pBVar24].baseValue;
        uVar25 = (ulong)uVar15;
        bVar1 = local_1d0.table[(long)pBVar24].nbAdditionalBits;
        bVar13 = local_1b0.table[sVar9].nbAdditionalBits;
        bVar2 = local_1c0.table[(long)pBVar29].nbAdditionalBits;
        local_158 = (BYTE *)(ulong)local_1d0.table[(long)pBVar24].nextState;
        local_138 = (ulong)local_1b0.table[sVar9].nextState;
        local_208 = (BYTE *)(ulong)local_1c0.table[(long)pBVar29].nextState;
        bVar14 = local_1d0.table[(long)pBVar24].nbBits;
        local_160 = (BYTE *)CONCAT44(local_160._4_4_,(uint)bVar14);
        bVar3 = local_1b0.table[sVar9].nbBits;
        local_140 = (BYTE *)CONCAT44(local_140._4_4_,(uint)bVar3);
        bVar12 = (byte)uVar7;
        if (bVar2 < 2) {
          if (bVar2 == 0) {
            pBVar21 = local_1a0[uVar15 == 0];
            local_1a0[1] = local_1a0[uVar15 != 0];
          }
          else {
            uVar7 = uVar7 + 1;
            local_1f8.bitsConsumed = uVar7;
            lVar10 = (ulong)(local_1c0.table[(long)pBVar29].baseValue + (uint)(uVar15 == 0)) -
                     (((long)local_240 << (bVar12 & 0x3f)) >> 0x3f);
            if (lVar10 == 3) {
              pBVar21 = local_1a0[1] + -1;
            }
            else {
              pBVar21 = local_1a0[lVar10];
            }
            pBVar21 = (BYTE *)(-(ulong)(pBVar21 == (BYTE *)0x0) | (ulong)pBVar21);
            if (lVar10 != 1) {
              local_1a0[2] = local_228;
            }
          }
        }
        else {
          uVar7 = uVar7 + bVar2;
          local_1f8.bitsConsumed = uVar7;
          local_1a0[2] = local_228;
          pBVar21 = (BYTE *)(((ulong)((long)local_240 << (bVar12 & 0x3f)) >> (-bVar2 & 0x3f)) +
                            (ulong)local_1c0.table[(long)pBVar29].baseValue);
        }
        local_1a0[0] = pBVar21;
        if (bVar13 != 0) {
          bVar12 = (byte)uVar7;
          uVar7 = uVar7 + bVar13;
          local_1f8.bitsConsumed = uVar7;
          uVar20 = uVar20 + ((ulong)((long)local_240 << (bVar12 & 0x3f)) >> (-bVar13 & 0x3f));
        }
        if (0x1e < (byte)(bVar13 + bVar1 + bVar2)) {
          if (uVar7 < 0x41) {
            if (pBVar27 < local_1f8.limitPtr) {
              local_130 = pBVar21;
              if (pBVar27 != (BYTE *)local_1f8.start) {
                uVar15 = (int)pBVar27 - (int)local_1f8.start;
                if (local_1f8.start <= pBVar27 + -(ulong)(uVar7 >> 3)) {
                  uVar15 = uVar7 >> 3;
                }
                pBVar27 = pBVar27 + -(ulong)uVar15;
                local_1f8.bitsConsumed = uVar7 + uVar15 * -8;
                local_240 = *(BYTE **)pBVar27;
                pBVar21 = local_130;
                uVar7 = local_1f8.bitsConsumed;
                local_1f8.bitContainer = (BitContainerType)local_240;
                local_1f8.ptr = (char *)pBVar27;
              }
            }
            else {
              pBVar27 = pBVar27 + -(ulong)(uVar7 >> 3);
              local_1f8._8_8_ = CONCAT44(local_1f8._12_4_,uVar7) & 0xffffffff00000007;
              local_240 = *(BYTE **)pBVar27;
              uVar7 = uVar7 & 7;
              local_1f8.bitContainer = (BitContainerType)local_240;
              local_1f8.ptr = (char *)pBVar27;
            }
          }
          else {
            pBVar27 = "";
            local_1f8.ptr = "";
          }
        }
        if (bVar1 != 0) {
          bVar13 = (byte)uVar7;
          uVar7 = uVar7 + bVar1;
          local_1f8.bitsConsumed = uVar7;
          uVar25 = uVar25 + ((ulong)((long)local_240 << (bVar13 & 0x3f)) >> (-bVar1 & 0x3f));
        }
        if ((ulong *)(ulong)(uVar23 - 1) != puVar26) {
          iVar8 = uVar7 + bVar14;
          pBVar24 = (BYTE *)(ulong)local_1d0.table[(long)pBVar24].nextState +
                    (~(-1L << (bVar14 & 0x3f)) & (ulong)local_240 >> (-(char)iVar8 & 0x3fU));
          iVar8 = iVar8 + (uint)bVar3;
          uVar7 = iVar8 + (uint)local_1c0.table[(long)pBVar29].nbBits;
          sVar9 = (~(-1L << (bVar3 & 0x3f)) & (ulong)local_240 >> (-(char)iVar8 & 0x3fU)) +
                  (ulong)local_1b0.table[sVar9].nextState;
          pBVar29 = local_208 +
                    (~(-1L << (local_1c0.table[(long)pBVar29].nbBits & 0x3f)) &
                    (ulong)local_240 >> (-(char)uVar7 & 0x3fU));
          local_1f8.bitsConsumed = uVar7;
          local_1d0.state = (size_t)pBVar24;
          local_1c0.state = (size_t)pBVar29;
          local_1b0.state = sVar9;
          if (uVar7 < 0x41) {
            if (pBVar27 < local_1f8.limitPtr) {
              if (pBVar27 == (BYTE *)local_1f8.start) goto LAB_01d999e8;
              uVar15 = (int)pBVar27 - (int)local_1f8.start;
              if (local_1f8.start <= pBVar27 + -(ulong)(uVar7 >> 3)) {
                uVar15 = uVar7 >> 3;
              }
              uVar7 = uVar7 + uVar15 * -8;
            }
            else {
              uVar15 = uVar7 >> 3;
              uVar7 = uVar7 & 7;
            }
            pBVar27 = pBVar27 + -(ulong)uVar15;
            local_1f8.bitsConsumed = uVar7;
            local_240 = *(BYTE **)pBVar27;
            local_1f8.bitContainer = (BitContainerType)local_240;
            local_1f8.ptr = (char *)pBVar27;
          }
          else {
            pBVar27 = "";
            local_1f8.ptr = "";
          }
        }
LAB_01d999e8:
        puVar28[-2] = uVar25;
        puVar28[-1] = uVar20;
        *puVar28 = (ulong)pBVar21;
        puVar26 = (ulong *)((long)puVar26 + 1);
        puVar28 = puVar28 + 3;
        local_228 = local_1a0[1];
      } while ((ulong *)(ulong)local_14c != puVar26);
      uVar23 = (uint)local_230;
    }
    dst = local_200;
    uVar7 = (uint)puVar26;
    if ((int)(uint)puVar26 < (int)uVar23) {
      local_138 = CONCAT44(local_138._4_4_,uVar23 - 1);
      local_140 = local_218 + -0x20;
      local_158 = dctx->litExtraBuffer;
      local_160 = dctx->litExtraBuffer + 0x10000;
      do {
        local_180 = (BYTE *)(ulong)local_1b0.table[local_1b0.state].baseValue;
        uVar23 = local_1d0.table[local_1d0.state].baseValue;
        local_240 = (BYTE *)(ulong)uVar23;
        bVar1 = local_1d0.table[local_1d0.state].nbAdditionalBits;
        bVar13 = local_1b0.table[local_1b0.state].nbAdditionalBits;
        bVar2 = local_1c0.table[local_1c0.state].nbAdditionalBits;
        bVar14 = (byte)local_1f8.bitsConsumed;
        if (bVar2 < 2) {
          if (bVar2 != 0) {
            local_1f8.bitsConsumed = local_1f8.bitsConsumed + 1;
            lVar10 = (ulong)(local_1c0.table[local_1c0.state].baseValue + (uint)(uVar23 == 0)) -
                     ((long)(local_1f8.bitContainer << (bVar14 & 0x3f)) >> 0x3f);
            if (lVar10 == 3) {
              local_1a0[0] = local_1a0[0] + -1;
            }
            else {
              local_1a0[0] = local_1a0[lVar10];
            }
            local_228 = (BYTE *)(-(ulong)(local_1a0[0] == (BYTE *)0x0) | (ulong)local_1a0[0]);
            if (lVar10 != 1) goto LAB_01d99ce7;
            goto LAB_01d99cf7;
          }
          local_228 = local_1a0[uVar23 == 0];
          ppBVar16 = local_1a0 + (uVar23 != 0);
        }
        else {
          local_1f8.bitsConsumed = local_1f8.bitsConsumed + bVar2;
          local_228 = (BYTE *)(((local_1f8.bitContainer << (bVar14 & 0x3f)) >> (-bVar2 & 0x3f)) +
                              (ulong)local_1c0.table[local_1c0.state].baseValue);
LAB_01d99ce7:
          local_1a0[2] = local_1a0[1];
LAB_01d99cf7:
          ppBVar16 = local_1a0;
        }
        local_1a0[1] = *ppBVar16;
        local_1a0[0] = local_228;
        if (bVar13 != 0) {
          bVar14 = (byte)local_1f8.bitsConsumed;
          local_1f8.bitsConsumed = local_1f8.bitsConsumed + bVar13;
          local_180 = (BYTE *)(ulong)local_1b0.table[local_1b0.state].baseValue +
                      ((local_1f8.bitContainer << (bVar14 & 0x3f)) >> (-bVar13 & 0x3f));
        }
        if (0x1e < (byte)(bVar13 + bVar1 + bVar2)) {
          if (local_1f8.bitsConsumed < 0x41) {
            if (local_1f8.ptr < local_1f8.limitPtr) {
              if (local_1f8.ptr == local_1f8.start) goto LAB_01d99d81;
              uVar23 = (int)local_1f8.ptr - (int)local_1f8.start;
              if (local_1f8.start <= local_1f8.ptr + -(ulong)(local_1f8.bitsConsumed >> 3)) {
                uVar23 = local_1f8.bitsConsumed >> 3;
              }
              uVar7 = local_1f8.bitsConsumed + uVar23 * -8;
            }
            else {
              uVar23 = local_1f8.bitsConsumed >> 3;
              uVar7 = local_1f8.bitsConsumed & 7;
            }
            local_1f8.ptr = local_1f8.ptr + -(ulong)uVar23;
            local_1f8.bitsConsumed = uVar7;
            local_1f8.bitContainer = *(BitContainerType *)local_1f8.ptr;
          }
          else {
            local_1f8.ptr = "";
          }
        }
LAB_01d99d81:
        if (bVar1 != 0) {
          bVar13 = (byte)local_1f8.bitsConsumed;
          local_1f8.bitsConsumed = local_1f8.bitsConsumed + bVar1;
          local_240 = local_240 + ((local_1f8.bitContainer << (bVar13 & 0x3f)) >> (-bVar1 & 0x3f));
        }
        uVar15 = (uint)puVar26;
        if (uVar15 != (uint)local_138) {
          iVar8 = local_1d0.table[local_1d0.state].nbBits + local_1f8.bitsConsumed;
          iVar22 = iVar8 + (uint)local_1b0.table[local_1b0.state].nbBits;
          local_1d0.state =
               (~(-1L << (local_1d0.table[local_1d0.state].nbBits & 0x3f)) &
               local_1f8.bitContainer >> (-(char)iVar8 & 0x3fU)) +
               (ulong)local_1d0.table[local_1d0.state].nextState;
          uVar23 = iVar22 + (uint)local_1c0.table[local_1c0.state].nbBits;
          local_1b0.state =
               (~(-1L << (local_1b0.table[local_1b0.state].nbBits & 0x3f)) &
               local_1f8.bitContainer >> (-(char)iVar22 & 0x3fU)) +
               (ulong)local_1b0.table[local_1b0.state].nextState;
          local_1c0.state =
               (~(-1L << (local_1c0.table[local_1c0.state].nbBits & 0x3f)) &
               local_1f8.bitContainer >> (-(char)uVar23 & 0x3fU)) +
               (ulong)local_1c0.table[local_1c0.state].nextState;
          local_1f8.bitsConsumed = uVar23;
          if (uVar23 < 0x41) {
            if (local_1f8.ptr < local_1f8.limitPtr) {
              if (local_1f8.ptr != local_1f8.start) {
                uVar7 = (int)local_1f8.ptr - (int)local_1f8.start;
                if (local_1f8.start <= local_1f8.ptr + -(ulong)(uVar23 >> 3)) {
                  uVar7 = uVar23 >> 3;
                }
                local_1f8.ptr = local_1f8.ptr + -(ulong)uVar7;
                local_1f8.bitsConsumed = uVar23 + uVar7 * -8;
                local_1f8.bitContainer = *(BitContainerType *)local_1f8.ptr;
              }
            }
            else {
              local_1f8.ptr = local_1f8.ptr + -(ulong)(uVar23 >> 3);
              local_1f8._8_8_ = CONCAT44(local_1f8._12_4_,uVar23) & 0xffffffff00000007;
              local_1f8.bitContainer = *(BitContainerType *)local_1f8.ptr;
            }
          }
          else {
            local_1f8.ptr = "";
          }
        }
        if (dctx->litBufferLocation == ZSTD_split) {
          uVar25 = (ulong)(uVar15 & 7);
          puVar26 = &local_f8 + uVar25 * 3;
          uVar20 = *puVar26;
          pBVar21 = local_248 + uVar20;
          if (pBVar21 <= dctx->litBufferEnd) {
            sVar18 = (&local_f0)[uVar25 * 3];
            uVar25 = local_e8[uVar25 * 3];
            if ((local_238 < pBVar21) ||
               (pBVar24 = (BYTE *)(sVar18 + uVar20),
               pBVar21 + -0x20 < (BYTE *)((long)dst + (long)pBVar24))) {
              sequence_00.matchLength = sVar18;
              sequence_00.litLength = uVar20;
              sequence_00.offset = uVar25;
              local_178 = uVar20;
              sStack_170 = sVar18;
              local_168 = uVar25;
              pBVar24 = (BYTE *)ZSTD_execSequenceEndSplitLitBuffer
                                          ((BYTE *)dst,local_218,pBVar21 + -0x20,sequence_00,
                                           &local_248,local_238,pBVar11,local_210,local_220);
            }
            else {
              pBVar27 = (BYTE *)((long)dst + uVar20);
              uVar4 = *(ulong *)(local_248 + 8);
              *(ulong *)dst = *(ulong *)local_248;
              *(ulong *)((long)dst + 8) = uVar4;
              if (0x10 < uVar20) {
                uVar4 = *(ulong *)(local_248 + 0x18);
                *(ulong *)((long)dst + 0x10) = *(ulong *)(local_248 + 0x10);
                *(ulong *)((long)dst + 0x18) = uVar4;
                if (0x10 < (long)(uVar20 - 0x10)) {
                  lVar10 = 0;
                  do {
                    uVar5 = *(undefined8 *)(local_248 + lVar10 + 0x20 + 8);
                    pBVar29 = (BYTE *)((long)dst + lVar10 + 0x20);
                    *(undefined8 *)pBVar29 = *(undefined8 *)(local_248 + lVar10 + 0x20);
                    *(undefined8 *)(pBVar29 + 8) = uVar5;
                    uVar5 = *(undefined8 *)(local_248 + lVar10 + 0x30 + 8);
                    *(undefined8 *)(pBVar29 + 0x10) = *(undefined8 *)(local_248 + lVar10 + 0x30);
                    *(undefined8 *)(pBVar29 + 0x18) = uVar5;
                    lVar10 = lVar10 + 0x20;
                  } while (pBVar29 + 0x20 < pBVar27);
                }
              }
              pBVar29 = pBVar27 + -uVar25;
              local_248 = pBVar21;
              if ((ulong)((long)pBVar27 - (long)pBVar11) < uVar25) {
                if ((ulong)((long)pBVar27 - (long)local_210) < uVar25) goto LAB_01d9a64b;
                lVar10 = (long)(pBVar27 + -uVar25) - (long)pBVar11;
                pBVar21 = local_220 + lVar10;
                if (pBVar21 + sVar18 <= local_220) goto LAB_01d9a14d;
                memmove(pBVar27,pBVar21,-lVar10);
                pBVar27 = pBVar27 + -lVar10;
                sVar18 = sVar18 + lVar10;
                pBVar29 = pBVar11;
              }
              if (uVar25 < 0x10) {
                if (uVar25 < 8) {
                  iVar8 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                   ::dec64table + uVar25 * 4);
                  *pBVar27 = *pBVar29;
                  pBVar27[1] = pBVar29[1];
                  pBVar27[2] = pBVar29[2];
                  pBVar27[3] = pBVar29[3];
                  pBVar21 = pBVar29 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                ::dec32table + uVar25 * 4);
                  pBVar29 = pBVar29 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar25 * 4) - (long)iVar8);
                  *(undefined4 *)(pBVar27 + 4) = *(undefined4 *)pBVar21;
                }
                else {
                  *(undefined8 *)pBVar27 = *(undefined8 *)pBVar29;
                }
                if (8 < sVar18) {
                  pBVar21 = pBVar29 + 8;
                  pBVar19 = pBVar27 + 8;
                  if ((long)pBVar19 - (long)pBVar21 < 0x10) {
                    do {
                      *(undefined8 *)pBVar19 = *(undefined8 *)pBVar21;
                      pBVar19 = pBVar19 + 8;
                      pBVar21 = pBVar21 + 8;
                    } while (pBVar19 < pBVar27 + sVar18);
                  }
                  else {
                    uVar5 = *(undefined8 *)(pBVar29 + 0x10);
                    *(undefined8 *)pBVar19 = *(undefined8 *)pBVar21;
                    *(undefined8 *)(pBVar27 + 0x10) = uVar5;
                    if (0x18 < (long)sVar18) {
                      lVar10 = 0;
                      do {
                        uVar5 = *(undefined8 *)(pBVar29 + lVar10 + 0x18 + 8);
                        pBVar21 = pBVar27 + lVar10 + 0x18;
                        *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar29 + lVar10 + 0x18);
                        *(undefined8 *)(pBVar21 + 8) = uVar5;
                        uVar5 = *(undefined8 *)(pBVar29 + lVar10 + 0x28 + 8);
                        *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(pBVar29 + lVar10 + 0x28);
                        *(undefined8 *)(pBVar21 + 0x18) = uVar5;
                        lVar10 = lVar10 + 0x20;
                      } while (pBVar21 + 0x20 < pBVar27 + sVar18);
                    }
                  }
                }
              }
              else {
                uVar5 = *(undefined8 *)(pBVar29 + 8);
                *(undefined8 *)pBVar27 = *(undefined8 *)pBVar29;
                *(undefined8 *)(pBVar27 + 8) = uVar5;
                if (0x10 < (long)sVar18) {
                  lVar10 = 0x10;
                  do {
                    uVar5 = *(undefined8 *)(pBVar29 + lVar10 + 8);
                    pBVar21 = pBVar27 + lVar10;
                    *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar29 + lVar10);
                    *(undefined8 *)(pBVar21 + 8) = uVar5;
                    uVar5 = *(undefined8 *)(pBVar29 + lVar10 + 0x10 + 8);
                    *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(pBVar29 + lVar10 + 0x10);
                    *(undefined8 *)(pBVar21 + 0x18) = uVar5;
                    lVar10 = lVar10 + 0x20;
                  } while (pBVar21 + 0x20 < pBVar27 + sVar18);
                }
              }
            }
            goto LAB_01d9a19d;
          }
          uVar20 = (long)dctx->litBufferEnd - (long)local_248;
          if (uVar20 == 0) {
LAB_01d9a246:
            local_248 = local_158;
            dctx->litBufferLocation = ZSTD_not_in_dst;
            uVar20 = *puVar26;
            sVar18 = (&local_f0)[uVar25 * 3];
            uVar4 = local_e8[uVar25 * 3];
            if (((long)uVar20 < 0x10001) &&
               (pBVar21 = (BYTE *)(sVar18 + uVar20),
               (BYTE *)((long)dst + (long)pBVar21) <= local_140)) {
              pBVar24 = (BYTE *)((long)dst + uVar20);
              uVar6 = *(ulong *)(local_158 + 8);
              *(ulong *)dst = *(ulong *)local_158;
              *(ulong *)((long)dst + 8) = uVar6;
              if (0x10 < uVar20) {
                uVar6 = *(ulong *)(dctx->litExtraBuffer + 0x18);
                *(ulong *)((long)dst + 0x10) = *(ulong *)(dctx->litExtraBuffer + 0x10);
                *(ulong *)((long)dst + 0x18) = uVar6;
                if (0x10 < (long)(uVar20 - 0x10)) {
                  lVar10 = 0;
                  do {
                    uVar5 = *(undefined8 *)(dctx->litExtraBuffer + lVar10 + 0x20 + 8);
                    pBVar27 = (BYTE *)((long)dst + lVar10 + 0x20);
                    *(undefined8 *)pBVar27 = *(undefined8 *)(dctx->litExtraBuffer + lVar10 + 0x20);
                    *(undefined8 *)(pBVar27 + 8) = uVar5;
                    uVar5 = *(undefined8 *)(dctx->litExtraBuffer + lVar10 + 0x30 + 8);
                    *(undefined8 *)(pBVar27 + 0x10) =
                         *(undefined8 *)(dctx->litExtraBuffer + lVar10 + 0x30);
                    *(undefined8 *)(pBVar27 + 0x18) = uVar5;
                    lVar10 = lVar10 + 0x20;
                  } while (pBVar27 + 0x20 < pBVar24);
                }
              }
              local_248 = local_158 + uVar20;
              pBVar27 = pBVar24 + -uVar4;
              if ((ulong)((long)pBVar24 - (long)pBVar11) < uVar4) {
                local_148 = pBVar21;
                if ((ulong)((long)pBVar24 - (long)local_210) < uVar4) {
                  pBVar21 = (BYTE *)0xffffffffffffffec;
                }
                else {
                  lVar10 = (long)(pBVar24 + -uVar4) - (long)pBVar11;
                  pBVar21 = local_220 + lVar10;
                  if (local_220 < pBVar21 + sVar18) {
                    memmove(pBVar24,pBVar21,-lVar10);
                    pBVar24 = pBVar24 + -lVar10;
                    sVar18 = sVar18 + lVar10;
                    pBVar21 = local_148;
                    pBVar27 = pBVar11;
                    goto LAB_01d9a32a;
                  }
                  memmove(pBVar24,pBVar21,sVar18);
                  pBVar21 = local_148;
                }
              }
              else {
LAB_01d9a32a:
                if (uVar4 < 0x10) {
                  if (uVar4 < 8) {
                    iVar8 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                     ::dec64table + uVar4 * 4);
                    *pBVar24 = *pBVar27;
                    pBVar24[1] = pBVar27[1];
                    pBVar24[2] = pBVar27[2];
                    pBVar24[3] = pBVar27[3];
                    pBVar29 = pBVar27 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar4 * 4);
                    pBVar27 = pBVar27 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar4 * 4) - (long)iVar8);
                    *(undefined4 *)(pBVar24 + 4) = *(undefined4 *)pBVar29;
                  }
                  else {
                    *(undefined8 *)pBVar24 = *(undefined8 *)pBVar27;
                  }
                  if (8 < sVar18) {
                    pBVar29 = pBVar27 + 8;
                    pBVar19 = pBVar24 + 8;
                    if ((long)pBVar19 - (long)pBVar29 < 0x10) {
                      do {
                        *(undefined8 *)pBVar19 = *(undefined8 *)pBVar29;
                        pBVar19 = pBVar19 + 8;
                        pBVar29 = pBVar29 + 8;
                      } while (pBVar19 < pBVar24 + sVar18);
                    }
                    else {
                      uVar5 = *(undefined8 *)(pBVar27 + 0x10);
                      *(undefined8 *)pBVar19 = *(undefined8 *)pBVar29;
                      *(undefined8 *)(pBVar24 + 0x10) = uVar5;
                      if (0x18 < (long)sVar18) {
                        lVar10 = 0;
                        do {
                          uVar5 = *(undefined8 *)(pBVar27 + lVar10 + 0x18 + 8);
                          pBVar29 = pBVar24 + lVar10 + 0x18;
                          *(undefined8 *)pBVar29 = *(undefined8 *)(pBVar27 + lVar10 + 0x18);
                          *(undefined8 *)(pBVar29 + 8) = uVar5;
                          uVar5 = *(undefined8 *)(pBVar27 + lVar10 + 0x28 + 8);
                          *(undefined8 *)(pBVar29 + 0x10) = *(undefined8 *)(pBVar27 + lVar10 + 0x28)
                          ;
                          *(undefined8 *)(pBVar29 + 0x18) = uVar5;
                          lVar10 = lVar10 + 0x20;
                        } while (pBVar29 + 0x20 < pBVar24 + sVar18);
                      }
                    }
                  }
                }
                else {
                  uVar5 = *(undefined8 *)(pBVar27 + 8);
                  *(undefined8 *)pBVar24 = *(undefined8 *)pBVar27;
                  *(undefined8 *)(pBVar24 + 8) = uVar5;
                  if (0x10 < (long)sVar18) {
                    lVar10 = 0x10;
                    do {
                      uVar5 = *(undefined8 *)(pBVar27 + lVar10 + 8);
                      pBVar29 = pBVar24 + lVar10;
                      *(undefined8 *)pBVar29 = *(undefined8 *)(pBVar27 + lVar10);
                      *(undefined8 *)(pBVar29 + 8) = uVar5;
                      uVar5 = *(undefined8 *)(pBVar27 + lVar10 + 0x10 + 8);
                      *(undefined8 *)(pBVar29 + 0x10) = *(undefined8 *)(pBVar27 + lVar10 + 0x10);
                      *(undefined8 *)(pBVar29 + 0x18) = uVar5;
                      lVar10 = lVar10 + 0x20;
                    } while (pBVar29 + 0x20 < pBVar24 + sVar18);
                  }
                }
              }
            }
            else {
              sequence_01.matchLength = sVar18;
              sequence_01.litLength = uVar20;
              sequence_01.offset = uVar4;
              local_178 = uVar20;
              sStack_170 = sVar18;
              local_168 = uVar4;
              pBVar21 = (BYTE *)ZSTD_execSequenceEnd
                                          ((BYTE *)dst,local_218,sequence_01,&local_248,local_160,
                                           pBVar11,local_210,local_220);
            }
            bVar30 = pBVar21 < (BYTE *)0xffffffffffffff89;
            if (bVar30) {
              *puVar26 = (ulong)local_240;
              (&local_f0)[uVar25 * 3] = (size_t)local_180;
              local_e8[uVar25 * 3] = (ulong)local_228;
              dst = (void *)((long)dst + (long)pBVar21);
              bVar30 = true;
              local_238 = local_160;
            }
            else {
              local_238 = local_160;
              local_208 = pBVar21;
            }
          }
          else {
            if (uVar20 <= (ulong)((long)local_218 - (long)dst)) {
              ZSTD_safecopyDstBeforeSrc((BYTE *)dst,local_248,uVar20);
              *puVar26 = *puVar26 - uVar20;
              dst = (void *)((long)dst + uVar20);
              goto LAB_01d9a246;
            }
            local_208 = (BYTE *)0xffffffffffffffba;
            bVar30 = false;
          }
          if (bVar30) goto LAB_01d9a42e;
          bVar30 = false;
        }
        else {
          uVar25 = (ulong)(uVar15 & 7);
          uVar20 = (&local_f8)[uVar25 * 3];
          sVar18 = (&local_f0)[uVar25 * 3];
          uVar25 = local_e8[uVar25 * 3];
          pBVar21 = local_248 + uVar20;
          if ((local_238 < pBVar21) ||
             (pBVar24 = (BYTE *)(sVar18 + uVar20), local_140 < (BYTE *)((long)dst + (long)pBVar24)))
          {
            sequence.matchLength = sVar18;
            sequence.litLength = uVar20;
            sequence.offset = uVar25;
            local_178 = uVar20;
            sStack_170 = sVar18;
            local_168 = uVar25;
            pBVar24 = (BYTE *)ZSTD_execSequenceEnd
                                        ((BYTE *)dst,local_218,sequence,&local_248,local_238,pBVar11
                                         ,local_210,local_220);
          }
          else {
            pBVar27 = (BYTE *)((long)dst + uVar20);
            uVar4 = *(ulong *)(local_248 + 8);
            *(ulong *)dst = *(ulong *)local_248;
            *(ulong *)((long)dst + 8) = uVar4;
            if (0x10 < uVar20) {
              uVar4 = *(ulong *)(local_248 + 0x18);
              *(ulong *)((long)dst + 0x10) = *(ulong *)(local_248 + 0x10);
              *(ulong *)((long)dst + 0x18) = uVar4;
              if (0x10 < (long)(uVar20 - 0x10)) {
                lVar10 = 0;
                do {
                  uVar5 = *(undefined8 *)(local_248 + lVar10 + 0x20 + 8);
                  pBVar29 = (BYTE *)((long)dst + lVar10 + 0x20);
                  *(undefined8 *)pBVar29 = *(undefined8 *)(local_248 + lVar10 + 0x20);
                  *(undefined8 *)(pBVar29 + 8) = uVar5;
                  uVar5 = *(undefined8 *)(local_248 + lVar10 + 0x30 + 8);
                  *(undefined8 *)(pBVar29 + 0x10) = *(undefined8 *)(local_248 + lVar10 + 0x30);
                  *(undefined8 *)(pBVar29 + 0x18) = uVar5;
                  lVar10 = lVar10 + 0x20;
                } while (pBVar29 + 0x20 < pBVar27);
              }
            }
            pBVar29 = pBVar27 + -uVar25;
            local_248 = pBVar21;
            if ((ulong)((long)pBVar27 - (long)pBVar11) < uVar25) {
              if ((ulong)((long)pBVar27 - (long)local_210) < uVar25) {
LAB_01d9a64b:
                pBVar24 = (BYTE *)0xffffffffffffffec;
              }
              else {
                lVar10 = (long)(pBVar27 + -uVar25) - (long)pBVar11;
                pBVar21 = local_220 + lVar10;
                if (local_220 < pBVar21 + sVar18) {
                  memmove(pBVar27,pBVar21,-lVar10);
                  pBVar27 = pBVar27 + -lVar10;
                  sVar18 = sVar18 + lVar10;
                  pBVar29 = pBVar11;
                  goto LAB_01d9a03a;
                }
LAB_01d9a14d:
                memmove(pBVar27,pBVar21,sVar18);
              }
            }
            else {
LAB_01d9a03a:
              if (uVar25 < 0x10) {
                if (uVar25 < 8) {
                  iVar8 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                   ::dec64table + uVar25 * 4);
                  *pBVar27 = *pBVar29;
                  pBVar27[1] = pBVar29[1];
                  pBVar27[2] = pBVar29[2];
                  pBVar27[3] = pBVar29[3];
                  pBVar21 = pBVar29 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                ::dec32table + uVar25 * 4);
                  pBVar29 = pBVar29 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar25 * 4) - (long)iVar8);
                  *(undefined4 *)(pBVar27 + 4) = *(undefined4 *)pBVar21;
                }
                else {
                  *(undefined8 *)pBVar27 = *(undefined8 *)pBVar29;
                }
                if (8 < sVar18) {
                  pBVar21 = pBVar29 + 8;
                  pBVar19 = pBVar27 + 8;
                  if ((long)pBVar19 - (long)pBVar21 < 0x10) {
                    do {
                      *(undefined8 *)pBVar19 = *(undefined8 *)pBVar21;
                      pBVar19 = pBVar19 + 8;
                      pBVar21 = pBVar21 + 8;
                    } while (pBVar19 < pBVar27 + sVar18);
                  }
                  else {
                    uVar5 = *(undefined8 *)(pBVar29 + 0x10);
                    *(undefined8 *)pBVar19 = *(undefined8 *)pBVar21;
                    *(undefined8 *)(pBVar27 + 0x10) = uVar5;
                    if (0x18 < (long)sVar18) {
                      lVar10 = 0;
                      do {
                        uVar5 = *(undefined8 *)(pBVar29 + lVar10 + 0x18 + 8);
                        pBVar21 = pBVar27 + lVar10 + 0x18;
                        *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar29 + lVar10 + 0x18);
                        *(undefined8 *)(pBVar21 + 8) = uVar5;
                        uVar5 = *(undefined8 *)(pBVar29 + lVar10 + 0x28 + 8);
                        *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(pBVar29 + lVar10 + 0x28);
                        *(undefined8 *)(pBVar21 + 0x18) = uVar5;
                        lVar10 = lVar10 + 0x20;
                      } while (pBVar21 + 0x20 < pBVar27 + sVar18);
                    }
                  }
                }
              }
              else {
                uVar5 = *(undefined8 *)(pBVar29 + 8);
                *(undefined8 *)pBVar27 = *(undefined8 *)pBVar29;
                *(undefined8 *)(pBVar27 + 8) = uVar5;
                if (0x10 < (long)sVar18) {
                  lVar10 = 0x10;
                  do {
                    uVar5 = *(undefined8 *)(pBVar29 + lVar10 + 8);
                    pBVar21 = pBVar27 + lVar10;
                    *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar29 + lVar10);
                    *(undefined8 *)(pBVar21 + 8) = uVar5;
                    uVar5 = *(undefined8 *)(pBVar29 + lVar10 + 0x10 + 8);
                    *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(pBVar29 + lVar10 + 0x10);
                    *(undefined8 *)(pBVar21 + 0x18) = uVar5;
                    lVar10 = lVar10 + 0x20;
                  } while (pBVar21 + 0x20 < pBVar27 + sVar18);
                }
              }
            }
          }
LAB_01d9a19d:
          if (pBVar24 < (BYTE *)0xffffffffffffff89) {
            uVar20 = (ulong)(uVar15 & 7);
            (&local_f8)[uVar20 * 3] = (ulong)local_240;
            (&local_f0)[uVar20 * 3] = (size_t)local_180;
            local_e8[uVar20 * 3] = (ulong)local_228;
            dst = (void *)((long)dst + (long)pBVar24);
LAB_01d9a42e:
            bVar30 = true;
          }
          else {
            bVar30 = false;
            local_208 = pBVar24;
          }
        }
        uVar23 = (uint)local_230;
        if (!bVar30) goto LAB_01d9b4ab;
        puVar26 = (ulong *)(ulong)(uVar15 + 1);
        uVar7 = uVar23;
      } while (uVar15 + 1 != uVar23);
    }
    bVar30 = false;
    if ((local_1f8.ptr == local_1f8.start) && (local_1f8.bitsConsumed == 0x40)) {
      uVar7 = uVar7 - local_14c;
      if ((int)uVar7 < (int)uVar23) {
        local_240 = local_218 + -0x20;
        pBVar21 = dctx->litExtraBuffer;
        local_180 = dctx->litExtraBuffer + 0x10000;
        do {
          uVar20 = (ulong)(uVar7 & 7);
          puVar26 = &local_f8 + uVar20 * 3;
          if (dctx->litBufferLocation == ZSTD_split) {
            uVar25 = *puVar26;
            pBVar24 = local_248 + uVar25;
            if (pBVar24 <= dctx->litBufferEnd) {
              sVar18 = (&local_f0)[uVar20 * 3];
              uVar20 = local_e8[uVar20 * 3];
              if ((local_238 < pBVar24) ||
                 (pBVar27 = (BYTE *)(sVar18 + uVar25),
                 pBVar24 + -0x20 < (BYTE *)((long)dst + (long)pBVar27))) {
                sequence_03.matchLength = sVar18;
                sequence_03.litLength = uVar25;
                sequence_03.offset = uVar20;
                local_178 = uVar25;
                sStack_170 = sVar18;
                local_168 = uVar20;
                pBVar27 = (BYTE *)ZSTD_execSequenceEndSplitLitBuffer
                                            ((BYTE *)dst,local_218,pBVar24 + -0x20,sequence_03,
                                             &local_248,local_238,pBVar11,local_210,local_220);
              }
              else {
                pBVar29 = (BYTE *)((long)dst + uVar25);
                uVar4 = *(ulong *)(local_248 + 8);
                *(ulong *)dst = *(ulong *)local_248;
                *(ulong *)((long)dst + 8) = uVar4;
                if (0x10 < uVar25) {
                  uVar4 = *(ulong *)(local_248 + 0x18);
                  *(ulong *)((long)dst + 0x10) = *(ulong *)(local_248 + 0x10);
                  *(ulong *)((long)dst + 0x18) = uVar4;
                  if (0x10 < (long)(uVar25 - 0x10)) {
                    lVar10 = 0;
                    do {
                      uVar5 = *(undefined8 *)(local_248 + lVar10 + 0x20 + 8);
                      pBVar19 = (BYTE *)((long)dst + lVar10 + 0x20);
                      *(undefined8 *)pBVar19 = *(undefined8 *)(local_248 + lVar10 + 0x20);
                      *(undefined8 *)(pBVar19 + 8) = uVar5;
                      uVar5 = *(undefined8 *)(local_248 + lVar10 + 0x30 + 8);
                      *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)(local_248 + lVar10 + 0x30);
                      *(undefined8 *)(pBVar19 + 0x18) = uVar5;
                      lVar10 = lVar10 + 0x20;
                    } while (pBVar19 + 0x20 < pBVar29);
                  }
                }
                pBVar19 = pBVar29 + -uVar20;
                local_248 = pBVar24;
                if ((ulong)((long)pBVar29 - (long)pBVar11) < uVar20) {
                  if ((ulong)((long)pBVar29 - (long)local_210) < uVar20) {
                    pBVar27 = (BYTE *)0xffffffffffffffec;
                    goto LAB_01d9add0;
                  }
                  lVar10 = (long)(pBVar29 + -uVar20) - (long)pBVar11;
                  pBVar24 = local_220 + lVar10;
                  if (pBVar24 + sVar18 <= local_220) goto LAB_01d9ad7e;
                  memmove(pBVar29,pBVar24,-lVar10);
                  pBVar29 = pBVar29 + -lVar10;
                  sVar18 = sVar18 + lVar10;
                  pBVar19 = pBVar11;
                }
                if (uVar20 < 0x10) {
                  if (uVar20 < 8) {
                    iVar8 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                     ::dec64table + uVar20 * 4);
                    *pBVar29 = *pBVar19;
                    pBVar29[1] = pBVar19[1];
                    pBVar29[2] = pBVar19[2];
                    pBVar29[3] = pBVar19[3];
                    pBVar24 = pBVar19 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar20 * 4);
                    pBVar19 = pBVar19 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar20 * 4) - (long)iVar8);
                    *(undefined4 *)(pBVar29 + 4) = *(undefined4 *)pBVar24;
                  }
                  else {
                    *(undefined8 *)pBVar29 = *(undefined8 *)pBVar19;
                  }
                  if (8 < sVar18) {
                    pBVar24 = pBVar19 + 8;
                    pBVar17 = pBVar29 + 8;
                    if ((long)pBVar17 - (long)pBVar24 < 0x10) {
                      do {
                        *(undefined8 *)pBVar17 = *(undefined8 *)pBVar24;
                        pBVar17 = pBVar17 + 8;
                        pBVar24 = pBVar24 + 8;
                      } while (pBVar17 < pBVar29 + sVar18);
                    }
                    else {
                      uVar5 = *(undefined8 *)(pBVar19 + 0x10);
                      *(undefined8 *)pBVar17 = *(undefined8 *)pBVar24;
                      *(undefined8 *)(pBVar29 + 0x10) = uVar5;
                      if (0x18 < (long)sVar18) {
                        lVar10 = 0;
                        do {
                          uVar5 = *(undefined8 *)(pBVar19 + lVar10 + 0x18 + 8);
                          pBVar24 = pBVar29 + lVar10 + 0x18;
                          *(undefined8 *)pBVar24 = *(undefined8 *)(pBVar19 + lVar10 + 0x18);
                          *(undefined8 *)(pBVar24 + 8) = uVar5;
                          uVar5 = *(undefined8 *)(pBVar19 + lVar10 + 0x28 + 8);
                          *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)(pBVar19 + lVar10 + 0x28)
                          ;
                          *(undefined8 *)(pBVar24 + 0x18) = uVar5;
                          lVar10 = lVar10 + 0x20;
                        } while (pBVar24 + 0x20 < pBVar29 + sVar18);
                      }
                    }
                  }
                }
                else {
                  uVar5 = *(undefined8 *)(pBVar19 + 8);
                  *(undefined8 *)pBVar29 = *(undefined8 *)pBVar19;
                  *(undefined8 *)(pBVar29 + 8) = uVar5;
                  if (0x10 < (long)sVar18) {
                    lVar10 = 0x10;
                    do {
                      uVar5 = *(undefined8 *)(pBVar19 + lVar10 + 8);
                      pBVar24 = pBVar29 + lVar10;
                      *(undefined8 *)pBVar24 = *(undefined8 *)(pBVar19 + lVar10);
                      *(undefined8 *)(pBVar24 + 8) = uVar5;
                      uVar5 = *(undefined8 *)(pBVar19 + lVar10 + 0x10 + 8);
                      *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)(pBVar19 + lVar10 + 0x10);
                      *(undefined8 *)(pBVar24 + 0x18) = uVar5;
                      lVar10 = lVar10 + 0x20;
                    } while (pBVar24 + 0x20 < pBVar29 + sVar18);
                  }
                }
              }
              goto LAB_01d9add0;
            }
            uVar25 = (long)dctx->litBufferEnd - (long)local_248;
            if (uVar25 == 0) {
LAB_01d9ae2e:
              dctx->litBufferLocation = ZSTD_not_in_dst;
              uVar25 = *puVar26;
              sVar18 = (&local_f0)[uVar20 * 3];
              uVar20 = local_e8[uVar20 * 3];
              if (((long)uVar25 < 0x10001) &&
                 (pBVar24 = (BYTE *)(sVar18 + uVar25),
                 (BYTE *)((long)dst + (long)pBVar24) <= local_240)) {
                pBVar27 = (BYTE *)((long)dst + uVar25);
                uVar4 = *(ulong *)(dctx->litExtraBuffer + 8);
                *(ulong *)dst = *(ulong *)pBVar21;
                *(ulong *)((long)dst + 8) = uVar4;
                if (0x10 < uVar25) {
                  uVar4 = *(ulong *)(dctx->litExtraBuffer + 0x18);
                  *(ulong *)((long)dst + 0x10) = *(ulong *)(dctx->litExtraBuffer + 0x10);
                  *(ulong *)((long)dst + 0x18) = uVar4;
                  if (0x10 < (long)(uVar25 - 0x10)) {
                    lVar10 = 0;
                    do {
                      uVar5 = *(undefined8 *)(dctx->litExtraBuffer + lVar10 + 0x20 + 8);
                      pBVar29 = (BYTE *)((long)dst + lVar10 + 0x20);
                      *(undefined8 *)pBVar29 = *(undefined8 *)(dctx->litExtraBuffer + lVar10 + 0x20)
                      ;
                      *(undefined8 *)(pBVar29 + 8) = uVar5;
                      uVar5 = *(undefined8 *)(dctx->litExtraBuffer + lVar10 + 0x30 + 8);
                      *(undefined8 *)(pBVar29 + 0x10) =
                           *(undefined8 *)(dctx->litExtraBuffer + lVar10 + 0x30);
                      *(undefined8 *)(pBVar29 + 0x18) = uVar5;
                      lVar10 = lVar10 + 0x20;
                    } while (pBVar29 + 0x20 < pBVar27);
                  }
                }
                local_248 = pBVar21 + uVar25;
                pBVar29 = pBVar27 + -uVar20;
                if ((ulong)((long)pBVar27 - (long)pBVar11) < uVar20) {
                  if ((ulong)((long)pBVar27 - (long)local_210) < uVar20) {
                    pBVar24 = (BYTE *)0xffffffffffffffec;
                  }
                  else {
                    lVar10 = (long)(pBVar27 + -uVar20) - (long)pBVar11;
                    pBVar29 = local_220 + lVar10;
                    if (local_220 < pBVar29 + sVar18) {
                      memmove(pBVar27,pBVar29,-lVar10);
                      pBVar27 = pBVar27 + -lVar10;
                      sVar18 = sVar18 + lVar10;
                      pBVar29 = pBVar11;
                      goto LAB_01d9aeef;
                    }
                    memmove(pBVar27,pBVar29,sVar18);
                  }
                }
                else {
LAB_01d9aeef:
                  if (uVar20 < 0x10) {
                    if (uVar20 < 8) {
                      iVar8 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                       ::dec64table + uVar20 * 4);
                      *pBVar27 = *pBVar29;
                      pBVar27[1] = pBVar29[1];
                      pBVar27[2] = pBVar29[2];
                      pBVar27[3] = pBVar29[3];
                      pBVar19 = pBVar29 + *(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar20 * 4);
                      pBVar29 = pBVar29 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar20 * 4) - (long)iVar8);
                      *(undefined4 *)(pBVar27 + 4) = *(undefined4 *)pBVar19;
                    }
                    else {
                      *(undefined8 *)pBVar27 = *(undefined8 *)pBVar29;
                    }
                    if (8 < sVar18) {
                      pBVar19 = pBVar29 + 8;
                      pBVar17 = pBVar27 + 8;
                      if ((long)pBVar17 - (long)pBVar19 < 0x10) {
                        do {
                          *(undefined8 *)pBVar17 = *(undefined8 *)pBVar19;
                          pBVar17 = pBVar17 + 8;
                          pBVar19 = pBVar19 + 8;
                        } while (pBVar17 < pBVar27 + sVar18);
                      }
                      else {
                        uVar5 = *(undefined8 *)(pBVar29 + 0x10);
                        *(undefined8 *)pBVar17 = *(undefined8 *)pBVar19;
                        *(undefined8 *)(pBVar27 + 0x10) = uVar5;
                        if (0x18 < (long)sVar18) {
                          lVar10 = 0;
                          do {
                            uVar5 = *(undefined8 *)(pBVar29 + lVar10 + 0x18 + 8);
                            pBVar19 = pBVar27 + lVar10 + 0x18;
                            *(undefined8 *)pBVar19 = *(undefined8 *)(pBVar29 + lVar10 + 0x18);
                            *(undefined8 *)(pBVar19 + 8) = uVar5;
                            uVar5 = *(undefined8 *)(pBVar29 + lVar10 + 0x28 + 8);
                            *(undefined8 *)(pBVar19 + 0x10) =
                                 *(undefined8 *)(pBVar29 + lVar10 + 0x28);
                            *(undefined8 *)(pBVar19 + 0x18) = uVar5;
                            lVar10 = lVar10 + 0x20;
                          } while (pBVar19 + 0x20 < pBVar27 + sVar18);
                        }
                      }
                    }
                  }
                  else {
                    uVar5 = *(undefined8 *)(pBVar29 + 8);
                    *(undefined8 *)pBVar27 = *(undefined8 *)pBVar29;
                    *(undefined8 *)(pBVar27 + 8) = uVar5;
                    if (0x10 < (long)sVar18) {
                      lVar10 = 0x10;
                      do {
                        uVar5 = *(undefined8 *)(pBVar29 + lVar10 + 8);
                        pBVar19 = pBVar27 + lVar10;
                        *(undefined8 *)pBVar19 = *(undefined8 *)(pBVar29 + lVar10);
                        *(undefined8 *)(pBVar19 + 8) = uVar5;
                        uVar5 = *(undefined8 *)(pBVar29 + lVar10 + 0x10 + 8);
                        *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)(pBVar29 + lVar10 + 0x10);
                        *(undefined8 *)(pBVar19 + 0x18) = uVar5;
                        lVar10 = lVar10 + 0x20;
                      } while (pBVar19 + 0x20 < pBVar27 + sVar18);
                    }
                  }
                }
              }
              else {
                sequence_04.matchLength = sVar18;
                sequence_04.litLength = uVar25;
                sequence_04.offset = uVar20;
                local_248 = pBVar21;
                local_178 = uVar25;
                sStack_170 = sVar18;
                local_168 = uVar20;
                pBVar24 = (BYTE *)ZSTD_execSequenceEnd
                                            ((BYTE *)dst,local_218,sequence_04,&local_248,local_180,
                                             pBVar11,local_210,local_220);
              }
              bVar30 = pBVar24 < (BYTE *)0xffffffffffffff89;
              if (!bVar30) {
                local_208 = pBVar24;
                pBVar24 = (BYTE *)0x0;
              }
              dst = (void *)((long)dst + (long)pBVar24);
              local_238 = local_180;
            }
            else {
              if (uVar25 <= (ulong)((long)local_218 - (long)dst)) {
                ZSTD_safecopyDstBeforeSrc((BYTE *)dst,local_248,uVar25);
                *puVar26 = *puVar26 - uVar25;
                dst = (void *)((long)dst + uVar25);
                goto LAB_01d9ae2e;
              }
              local_208 = (BYTE *)0xffffffffffffffba;
              bVar30 = false;
            }
            uVar23 = (uint)local_230;
            if (bVar30) goto LAB_01d9af9d;
            bVar30 = false;
          }
          else {
            uVar25 = *puVar26;
            sVar18 = (&local_f0)[uVar20 * 3];
            uVar20 = local_e8[uVar20 * 3];
            pBVar24 = local_248 + uVar25;
            if ((local_238 < pBVar24) ||
               (pBVar27 = (BYTE *)(sVar18 + uVar25), local_240 < (BYTE *)((long)dst + (long)pBVar27)
               )) {
              sequence_02.matchLength = sVar18;
              sequence_02.litLength = uVar25;
              sequence_02.offset = uVar20;
              local_178 = uVar25;
              sStack_170 = sVar18;
              local_168 = uVar20;
              pBVar27 = (BYTE *)ZSTD_execSequenceEnd
                                          ((BYTE *)dst,local_218,sequence_02,&local_248,local_238,
                                           pBVar11,local_210,local_220);
            }
            else {
              pBVar29 = (BYTE *)((long)dst + uVar25);
              uVar4 = *(ulong *)(local_248 + 8);
              *(ulong *)dst = *(ulong *)local_248;
              *(ulong *)((long)dst + 8) = uVar4;
              if (0x10 < uVar25) {
                uVar4 = *(ulong *)(local_248 + 0x18);
                *(ulong *)((long)dst + 0x10) = *(ulong *)(local_248 + 0x10);
                *(ulong *)((long)dst + 0x18) = uVar4;
                if (0x10 < (long)(uVar25 - 0x10)) {
                  lVar10 = 0;
                  do {
                    uVar5 = *(undefined8 *)(local_248 + lVar10 + 0x20 + 8);
                    pBVar19 = (BYTE *)((long)dst + lVar10 + 0x20);
                    *(undefined8 *)pBVar19 = *(undefined8 *)(local_248 + lVar10 + 0x20);
                    *(undefined8 *)(pBVar19 + 8) = uVar5;
                    uVar5 = *(undefined8 *)(local_248 + lVar10 + 0x30 + 8);
                    *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)(local_248 + lVar10 + 0x30);
                    *(undefined8 *)(pBVar19 + 0x18) = uVar5;
                    lVar10 = lVar10 + 0x20;
                  } while (pBVar19 + 0x20 < pBVar29);
                }
              }
              pBVar19 = pBVar29 + -uVar20;
              local_248 = pBVar24;
              if ((ulong)((long)pBVar29 - (long)pBVar11) < uVar20) {
                if ((ulong)((long)pBVar29 - (long)local_210) < uVar20) {
                  pBVar27 = (BYTE *)0xffffffffffffffec;
                }
                else {
                  lVar10 = (long)(pBVar29 + -uVar20) - (long)pBVar11;
                  pBVar24 = local_220 + lVar10;
                  if (local_220 < pBVar24 + sVar18) {
                    memmove(pBVar29,pBVar24,-lVar10);
                    pBVar29 = pBVar29 + -lVar10;
                    sVar18 = sVar18 + lVar10;
                    pBVar19 = pBVar11;
                    goto LAB_01d9ac62;
                  }
LAB_01d9ad7e:
                  memmove(pBVar29,pBVar24,sVar18);
                }
              }
              else {
LAB_01d9ac62:
                if (uVar20 < 0x10) {
                  if (uVar20 < 8) {
                    iVar8 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                     ::dec64table + uVar20 * 4);
                    *pBVar29 = *pBVar19;
                    pBVar29[1] = pBVar19[1];
                    pBVar29[2] = pBVar19[2];
                    pBVar29[3] = pBVar19[3];
                    pBVar24 = pBVar19 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar20 * 4);
                    pBVar19 = pBVar19 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar20 * 4) - (long)iVar8);
                    *(undefined4 *)(pBVar29 + 4) = *(undefined4 *)pBVar24;
                  }
                  else {
                    *(undefined8 *)pBVar29 = *(undefined8 *)pBVar19;
                  }
                  if (8 < sVar18) {
                    pBVar24 = pBVar19 + 8;
                    pBVar17 = pBVar29 + 8;
                    if ((long)pBVar17 - (long)pBVar24 < 0x10) {
                      do {
                        *(undefined8 *)pBVar17 = *(undefined8 *)pBVar24;
                        pBVar17 = pBVar17 + 8;
                        pBVar24 = pBVar24 + 8;
                      } while (pBVar17 < pBVar29 + sVar18);
                    }
                    else {
                      uVar5 = *(undefined8 *)(pBVar19 + 0x10);
                      *(undefined8 *)pBVar17 = *(undefined8 *)pBVar24;
                      *(undefined8 *)(pBVar29 + 0x10) = uVar5;
                      if (0x18 < (long)sVar18) {
                        lVar10 = 0;
                        do {
                          uVar5 = *(undefined8 *)(pBVar19 + lVar10 + 0x18 + 8);
                          pBVar24 = pBVar29 + lVar10 + 0x18;
                          *(undefined8 *)pBVar24 = *(undefined8 *)(pBVar19 + lVar10 + 0x18);
                          *(undefined8 *)(pBVar24 + 8) = uVar5;
                          uVar5 = *(undefined8 *)(pBVar19 + lVar10 + 0x28 + 8);
                          *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)(pBVar19 + lVar10 + 0x28)
                          ;
                          *(undefined8 *)(pBVar24 + 0x18) = uVar5;
                          lVar10 = lVar10 + 0x20;
                        } while (pBVar24 + 0x20 < pBVar29 + sVar18);
                      }
                    }
                  }
                }
                else {
                  uVar5 = *(undefined8 *)(pBVar19 + 8);
                  *(undefined8 *)pBVar29 = *(undefined8 *)pBVar19;
                  *(undefined8 *)(pBVar29 + 8) = uVar5;
                  if (0x10 < (long)sVar18) {
                    lVar10 = 0x10;
                    do {
                      uVar5 = *(undefined8 *)(pBVar19 + lVar10 + 8);
                      pBVar24 = pBVar29 + lVar10;
                      *(undefined8 *)pBVar24 = *(undefined8 *)(pBVar19 + lVar10);
                      *(undefined8 *)(pBVar24 + 8) = uVar5;
                      uVar5 = *(undefined8 *)(pBVar19 + lVar10 + 0x10 + 8);
                      *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)(pBVar19 + lVar10 + 0x10);
                      *(undefined8 *)(pBVar24 + 0x18) = uVar5;
                      lVar10 = lVar10 + 0x20;
                    } while (pBVar24 + 0x20 < pBVar29 + sVar18);
                  }
                }
              }
            }
LAB_01d9add0:
            bVar30 = false;
            pBVar24 = pBVar27;
            if ((BYTE *)0xffffffffffffff88 < pBVar27) {
              local_208 = pBVar27;
              pBVar24 = (BYTE *)0x0;
            }
            dst = (void *)((long)dst + (long)pBVar24);
            uVar23 = (uint)local_230;
            if (pBVar27 < (BYTE *)0xffffffffffffff89) {
LAB_01d9af9d:
              bVar30 = true;
            }
          }
          if (!bVar30) goto LAB_01d9b4ab;
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar23);
      }
      lVar10 = 0;
      do {
        (dctx->entropy).rep[lVar10] = *(U32 *)(local_1a0 + lVar10);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      bVar30 = true;
      pBVar11 = local_208;
      pBVar21 = local_238;
    }
    else {
      pBVar11 = (BYTE *)0xffffffffffffffec;
      pBVar21 = local_238;
    }
  }
LAB_01d994dd:
  if (!bVar30) {
    return (size_t)pBVar11;
  }
LAB_01d994ee:
  if (dctx->litBufferLocation == ZSTD_split) {
    uVar25 = (long)pBVar21 - (long)local_248;
    uVar20 = (long)local_218 - (long)dst;
    if (uVar20 < uVar25) {
      pBVar11 = (BYTE *)0xffffffffffffffba;
    }
    else {
      if ((BYTE *)dst == (BYTE *)0x0) {
        dst = (BYTE *)0x0;
      }
      else {
        memmove(dst,local_248,uVar25);
        dst = (void *)((long)dst + uVar25);
      }
      local_248 = dctx->litExtraBuffer;
      pBVar21 = dctx->litExtraBuffer + 0x10000;
    }
    if (uVar20 < uVar25) {
      return (size_t)pBVar11;
    }
  }
  sVar18 = (long)pBVar21 - (long)local_248;
  uVar20 = (long)local_218 - (long)dst;
  if (uVar20 < sVar18) {
    pBVar11 = (BYTE *)0xffffffffffffffba;
  }
  else if ((BYTE *)dst == (BYTE *)0x0) {
    dst = (BYTE *)0x0;
  }
  else {
    memmove(dst,local_248,sVar18);
    dst = (void *)((long)dst + sVar18);
  }
  if (sVar18 <= uVar20) {
    pBVar11 = (BYTE *)((long)dst + -(long)local_200);
  }
  return (size_t)pBVar11;
LAB_01d9b4ab:
  bVar30 = false;
  pBVar11 = local_208;
  pBVar21 = local_238;
  goto LAB_01d994dd;
}

Assistant:

static size_t
ZSTD_decompressSequencesLong(ZSTD_DCtx* dctx,
                             void* dst, size_t maxDstSize,
                             const void* seqStart, size_t seqSize, int nbSeq,
                             const ZSTD_longOffset_e isLongOffset)
{
    DEBUGLOG(5, "ZSTD_decompressSequencesLong");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequencesLong_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
    }
#endif
  return ZSTD_decompressSequencesLong_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}